

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O0

void Imf_2_5::copyIntoFrameBuffer
               (char **readPtr,char *writePtr,char *endPtr,size_t xStride,bool fill,double fillValue
               ,Format format,PixelType typeInFrameBuffer,PixelType typeInFile)

{
  ArgExc *pAVar1;
  long in_RCX;
  float *in_RDX;
  float *in_RSI;
  long *in_RDI;
  byte in_R8B;
  int in_R9D;
  float fVar2;
  double in_XMM0_Qa;
  int in_stack_00000008;
  int in_stack_00000010;
  size_t i_5;
  half h_3;
  size_t i_4;
  uint ui_3;
  size_t i_3;
  float f_3;
  int numBytes;
  size_t i_2;
  uint ui_2;
  size_t i_1;
  float f_2;
  half h_2;
  size_t i;
  half h_1;
  uint ui_1;
  float f_1;
  uint ui;
  float f;
  half h;
  float fillVal_2;
  half fillVal_1;
  uint fillVal;
  half *in_stack_fffffffffffffeb8;
  char **in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  ulong local_c0;
  half local_b2;
  ulong local_b0;
  uint local_a8;
  unsigned_short local_a2;
  ulong local_a0;
  undefined1 local_94 [4];
  int local_90;
  unsigned_short local_8a;
  ulong local_88;
  undefined1 local_7c [4];
  ulong local_78;
  undefined1 local_70 [4];
  undefined2 local_6c;
  undefined2 local_6a;
  ulong local_68;
  half local_5e;
  uint local_5c;
  unsigned_short local_56;
  unsigned_short local_4e;
  undefined2 local_44;
  undefined2 local_42;
  unsigned_short local_3a;
  byte local_21;
  long local_20;
  float *local_18;
  float *local_10;
  long *local_8;
  
  local_21 = in_R8B & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (local_21 == 0) {
    if (in_R9D == 1) {
      if (in_stack_00000008 == 0) {
        if (in_stack_00000010 == 0) {
          local_21 = 0;
          for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
            Xdr::read<Imf_2_5::CharPtrIO,char_const*>
                      (in_stack_fffffffffffffec0,(uint *)in_stack_fffffffffffffeb8);
          }
        }
        else if (in_stack_00000010 == 1) {
          local_21 = 0;
          for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
            Xdr::read<Imf_2_5::CharPtrIO,char_const*>
                      (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
            local_44 = local_42;
            fVar2 = (float)halfToUint((half)0x28);
            *local_10 = fVar2;
          }
        }
        else {
          if (in_stack_00000010 != 2) {
            pAVar1 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::ArgExc::ArgExc(pAVar1,"Unknown pixel data type.");
            __cxa_throw(pAVar1,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
          }
          local_21 = 0;
          for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
            Xdr::read<Imf_2_5::CharPtrIO,char_const*>
                      (in_stack_fffffffffffffec0,(float *)in_stack_fffffffffffffeb8);
            fVar2 = (float)floatToUint(3.704086e-39);
            *local_10 = fVar2;
          }
        }
      }
      else if (in_stack_00000008 == 1) {
        if (in_stack_00000010 == 0) {
          local_21 = 0;
          for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
            Xdr::read<Imf_2_5::CharPtrIO,char_const*>
                      (in_stack_fffffffffffffec0,(uint *)in_stack_fffffffffffffeb8);
            local_4e = (unsigned_short)uintToHalf(0x285646);
            *(unsigned_short *)local_10 = local_4e;
          }
        }
        else if (in_stack_00000010 == 1) {
          local_21 = 0;
          for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
            Xdr::read<Imf_2_5::CharPtrIO,char_const*>
                      (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
          }
        }
        else {
          if (in_stack_00000010 != 2) {
            pAVar1 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::ArgExc::ArgExc(pAVar1,"Unknown pixel data type.");
            __cxa_throw(pAVar1,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
          }
          local_21 = 0;
          for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
            Xdr::read<Imf_2_5::CharPtrIO,char_const*>
                      (in_stack_fffffffffffffec0,(float *)in_stack_fffffffffffffeb8);
            local_56 = (unsigned_short)floatToHalf(3.704628e-39);
            *(unsigned_short *)local_10 = local_56;
          }
        }
      }
      else {
        if (in_stack_00000008 != 2) {
          pAVar1 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar1,"Unknown pixel data type.");
          __cxa_throw(pAVar1,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
        }
        if (in_stack_00000010 == 0) {
          local_21 = 0;
          for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
            Xdr::read<Imf_2_5::CharPtrIO,char_const*>
                      (in_stack_fffffffffffffec0,(uint *)in_stack_fffffffffffffeb8);
            *local_10 = (float)local_5c;
          }
        }
        else if (in_stack_00000010 == 1) {
          local_21 = 0;
          for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
            Xdr::read<Imf_2_5::CharPtrIO,char_const*>
                      (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
            fVar2 = half::operator_cast_to_float(&local_5e);
            *local_10 = fVar2;
          }
        }
        else {
          if (in_stack_00000010 != 2) {
            pAVar1 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::ArgExc::ArgExc(pAVar1,"Unknown pixel data type.");
            __cxa_throw(pAVar1,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
          }
          local_21 = 0;
          for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
            Xdr::read<Imf_2_5::CharPtrIO,char_const*>
                      (in_stack_fffffffffffffec0,(float *)in_stack_fffffffffffffeb8);
          }
        }
      }
    }
    else {
      local_8 = in_RDI;
      if (in_stack_00000008 == 0) {
        if (in_stack_00000010 == 0) {
          for (; local_10 <= in_RDX; local_10 = (float *)(in_RCX + (long)local_10)) {
            for (local_68 = 0; local_68 < 4; local_68 = local_68 + 1) {
              *(undefined1 *)((long)local_10 + local_68) = *(undefined1 *)(*in_RDI + local_68);
            }
            *in_RDI = *in_RDI + 4;
          }
        }
        else if (in_stack_00000010 == 1) {
          local_21 = 0;
          for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
            local_6c = *(undefined2 *)*local_8;
            local_6a = local_6c;
            fVar2 = (float)halfToUint((half)0x28);
            *local_10 = fVar2;
            *local_8 = *local_8 + 2;
          }
        }
        else {
          if (in_stack_00000010 != 2) {
            pAVar1 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::ArgExc::ArgExc(pAVar1,"Unknown pixel data type.");
            __cxa_throw(pAVar1,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
          }
          local_21 = 0;
          for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
            for (local_78 = 0; local_78 < 4; local_78 = local_78 + 1) {
              local_70[local_78] = *(undefined1 *)(*local_8 + local_78);
            }
            fVar2 = (float)floatToUint(3.706097e-39);
            *local_10 = fVar2;
            *local_8 = *local_8 + 4;
          }
        }
      }
      else if (in_stack_00000008 == 1) {
        if (in_stack_00000010 == 0) {
          local_21 = 0;
          for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
            for (local_88 = 0; local_88 < 4; local_88 = local_88 + 1) {
              local_7c[local_88] = *(undefined1 *)(*local_8 + local_88);
            }
            local_8a = (unsigned_short)uintToHalf(0x285c37);
            *(unsigned_short *)local_10 = local_8a;
            *local_8 = *local_8 + 4;
          }
        }
        else if (in_stack_00000010 == 1) {
          if (in_RCX == 2) {
            local_90 = ((int)in_RDX - (int)in_RSI) + 2;
            memcpy(in_RSI,(void *)*in_RDI,(long)local_90);
            *local_8 = *local_8 + (long)local_90;
          }
          else {
            for (; local_10 <= in_RDX; local_10 = (float *)(in_RCX + (long)local_10)) {
              *(unsigned_short *)local_10 = *(unsigned_short *)*in_RDI;
              *in_RDI = *in_RDI + 2;
            }
          }
        }
        else {
          if (in_stack_00000010 != 2) {
            pAVar1 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::ArgExc::ArgExc(pAVar1,"Unknown pixel data type.");
            __cxa_throw(pAVar1,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
          }
          local_21 = 0;
          for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
            for (local_a0 = 0; local_a0 < 4; local_a0 = local_a0 + 1) {
              local_94[local_a0] = *(undefined1 *)(*local_8 + local_a0);
            }
            local_a2 = (unsigned_short)floatToHalf(3.707097e-39);
            *(unsigned_short *)local_10 = local_a2;
            *local_8 = *local_8 + 4;
          }
        }
      }
      else {
        if (in_stack_00000008 != 2) {
          pAVar1 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar1,"Unknown pixel data type.");
          __cxa_throw(pAVar1,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
        }
        if (in_stack_00000010 == 0) {
          for (; local_10 <= in_RDX; local_10 = (float *)(in_RCX + (long)local_10)) {
            for (local_b0 = 0; local_b0 < 4; local_b0 = local_b0 + 1) {
              *(undefined1 *)((long)&local_a8 + local_b0) = *(undefined1 *)(*in_RDI + local_b0);
            }
            *local_10 = (float)local_a8;
            *in_RDI = *in_RDI + 4;
          }
        }
        else if (in_stack_00000010 == 1) {
          local_21 = 0;
          for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
            local_b2._h = *(unsigned_short *)*local_8;
            fVar2 = half::operator_cast_to_float(&local_b2);
            *local_10 = fVar2;
            *local_8 = *local_8 + 2;
          }
        }
        else {
          if (in_stack_00000010 != 2) {
            pAVar1 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::ArgExc::ArgExc(pAVar1,"Unknown pixel data type.");
            __cxa_throw(pAVar1,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
          }
          for (; local_10 <= in_RDX; local_10 = (float *)(in_RCX + (long)local_10)) {
            for (local_c0 = 0; local_c0 < 4; local_c0 = local_c0 + 1) {
              *(undefined1 *)((long)local_10 + local_c0) = *(undefined1 *)(*in_RDI + local_c0);
            }
            *in_RDI = *in_RDI + 4;
          }
        }
      }
    }
  }
  else if (in_stack_00000008 == 0) {
    for (; local_10 <= in_RDX; local_10 = (float *)(in_RCX + (long)local_10)) {
      *local_10 = (float)(long)in_XMM0_Qa;
    }
  }
  else if (in_stack_00000008 == 1) {
    half::half((half *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (float)((ulong)in_stack_fffffffffffffec8 >> 0x20));
    for (; local_10 <= local_18; local_10 = (float *)(local_20 + (long)local_10)) {
      *(unsigned_short *)local_10 = local_3a;
    }
  }
  else {
    if (in_stack_00000008 != 2) {
      pAVar1 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(pAVar1,"Unknown pixel data type.");
      __cxa_throw(pAVar1,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
    for (; local_10 <= in_RDX; local_10 = (float *)(in_RCX + (long)local_10)) {
      *local_10 = (float)in_XMM0_Qa;
    }
  }
  return;
}

Assistant:

void
copyIntoFrameBuffer (const char *& readPtr,
		     char * writePtr,
		     char * endPtr,
                     size_t xStride,
		     bool fill,
		     double fillValue,
                     Compressor::Format format,
                     PixelType typeInFrameBuffer,
                     PixelType typeInFile)
{
    //
    // Copy a horizontal row of pixels from an input
    // file's line or tile buffer to a frame buffer.
    //

    if (fill)
    {
        //
        // The file contains no data for this channel.
        // Store a default value in the frame buffer.
        //

        switch (typeInFrameBuffer)
        {
	  case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:
            
            {
                unsigned int fillVal = (unsigned int) (fillValue);

                while (writePtr <= endPtr)
                {
                    *(unsigned int *) writePtr = fillVal;
                    writePtr += xStride;
                }
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

            {
                half fillVal = half (fillValue);

                while (writePtr <= endPtr)
                {
                    *(half *) writePtr = fillVal;
                    writePtr += xStride;
                }
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

            {
                float fillVal = float (fillValue);

                while (writePtr <= endPtr)
                {
                    *(float *) writePtr = fillVal;
                    writePtr += xStride;
                }
            }
            break;

          default:

            throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
    else if (format == Compressor::XDR)
    {
        //
        // The the line or tile buffer is in XDR format.
        //
        // Convert the pixels from the file's machine-
        // independent representation, and store the
        // results in the frame buffer.
        //

        switch (typeInFrameBuffer)
        {
          case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:
    
            switch (typeInFile)
            {
              case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                while (writePtr <= endPtr)
                {
                    Xdr::read <CharPtrIO> (readPtr, *(unsigned int *) writePtr);
                    writePtr += xStride;
                }
                break;

              case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                while (writePtr <= endPtr)
                {
                    half h;
                    Xdr::read <CharPtrIO> (readPtr, h);
                    *(unsigned int *) writePtr = halfToUint (h);
                    writePtr += xStride;
                }
                break;

              case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                while (writePtr <= endPtr)
                {
                    float f;
                    Xdr::read <CharPtrIO> (readPtr, f);
                    *(unsigned int *)writePtr = floatToUint (f);
                    writePtr += xStride;
                }
                break;
                
              default:                  
                  throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

            switch (typeInFile)
            {
              case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                while (writePtr <= endPtr)
                {
                    unsigned int ui;
                    Xdr::read <CharPtrIO> (readPtr, ui);
                    *(half *) writePtr = uintToHalf (ui);
                    writePtr += xStride;
                }
                break;
                
              case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                while (writePtr <= endPtr)
                {
                    Xdr::read <CharPtrIO> (readPtr, *(half *) writePtr);
                    writePtr += xStride;
                }
                break;

              case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                while (writePtr <= endPtr)
                {
                    float f;
                    Xdr::read <CharPtrIO> (readPtr, f);
                    *(half *) writePtr = floatToHalf (f);
                    writePtr += xStride;
                }
                break;
              default:
                  
                  throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

            switch (typeInFile)
            {
              case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                while (writePtr <= endPtr)
                {
                    unsigned int ui;
                    Xdr::read <CharPtrIO> (readPtr, ui);
                    *(float *) writePtr = float (ui);
                    writePtr += xStride;
                }
                break;

              case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                while (writePtr <= endPtr)
                {
                    half h;
                    Xdr::read <CharPtrIO> (readPtr, h);
                    *(float *) writePtr = float (h);
                    writePtr += xStride;
                }
                break;

              case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                while (writePtr <= endPtr)
                {
                    Xdr::read <CharPtrIO> (readPtr, *(float *) writePtr);
                    writePtr += xStride;
                }
                break;
              default:
                  
                  throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
            }
            break;

          default:

            throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
    else
    {
        //
        // The the line or tile buffer is in NATIVE format.
        // Copy the results into the frame buffer.
        //

        switch (typeInFrameBuffer)
        {
          case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:
    
            switch (typeInFile)
            {
              case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                while (writePtr <= endPtr)
                {
                    for (size_t i = 0; i < sizeof (unsigned int); ++i)
                        writePtr[i] = readPtr[i];

                    readPtr += sizeof (unsigned int);
                    writePtr += xStride;
                }
                break;

              case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                while (writePtr <= endPtr)
                {
                    half h = *(half *) readPtr;
                    *(unsigned int *) writePtr = halfToUint (h);
                    readPtr += sizeof (half);
                    writePtr += xStride;
                }
                break;

              case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                while (writePtr <= endPtr)
                {
                    float f;

                    for (size_t i = 0; i < sizeof (float); ++i)
                        ((char *)&f)[i] = readPtr[i];

                    *(unsigned int *)writePtr = floatToUint (f);
                    readPtr += sizeof (float);
                    writePtr += xStride;
                }
                break;
                
              default:
                  
                  throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

            switch (typeInFile)
            {
              case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                while (writePtr <= endPtr)
                {
                    unsigned int ui;

                    for (size_t i = 0; i < sizeof (unsigned int); ++i)
                        ((char *)&ui)[i] = readPtr[i];

                    *(half *) writePtr = uintToHalf (ui);
                    readPtr += sizeof (unsigned int);
                    writePtr += xStride;
                }
                break;

              case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                // If we're tightly packed, just memcpy
                if (xStride == sizeof(half)) {
                    int numBytes = endPtr-writePtr+sizeof(half);
                    memcpy(writePtr, readPtr, numBytes);
                    readPtr  += numBytes;
                    writePtr += numBytes;                    
                } else {
                    while (writePtr <= endPtr)
                    {
                        *(half *) writePtr = *(half *)readPtr;
                        readPtr += sizeof (half);
                        writePtr += xStride;
                    }
                }
                break;

              case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                while (writePtr <= endPtr)
                {
                    float f;

                    for (size_t i = 0; i < sizeof (float); ++i)
                        ((char *)&f)[i] = readPtr[i];

                    *(half *) writePtr = floatToHalf (f);
                    readPtr += sizeof (float);
                    writePtr += xStride;
                }
                break;
              default:
                  
                  throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

            switch (typeInFile)
            {
              case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                while (writePtr <= endPtr)
                {
                    unsigned int ui;

                    for (size_t i = 0; i < sizeof (unsigned int); ++i)
                        ((char *)&ui)[i] = readPtr[i];

                    *(float *) writePtr = float (ui);
                    readPtr += sizeof (unsigned int);
                    writePtr += xStride;
                }
                break;

              case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                while (writePtr <= endPtr)
                {
                    half h = *(half *) readPtr;
                    *(float *) writePtr = float (h);
                    readPtr += sizeof (half);
                    writePtr += xStride;
                }
                break;

              case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                while (writePtr <= endPtr)
                {
                    for (size_t i = 0; i < sizeof (float); ++i)
                        writePtr[i] = readPtr[i];

                    readPtr += sizeof (float);
                    writePtr += xStride;
                }
                break;
              default:
                  
                  throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
            }
            break;

          default:

            throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
}